

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

string * getBoundType_abi_cxx11_(double lower,double upper)

{
  double val;
  bool bVar1;
  string *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  string *type;
  
  val = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = highs_isInfinity(-in_XMM0_Qa);
  if (bVar1) {
    bVar1 = highs_isInfinity(val);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)in_RDI,"FR");
    }
    else {
      std::__cxx11::string::operator=((string *)in_RDI,"UB");
    }
  }
  else {
    bVar1 = highs_isInfinity(val);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)in_RDI,"LB");
    }
    else if (val <= in_XMM0_Qa) {
      std::__cxx11::string::operator=((string *)in_RDI,"FX");
    }
    else {
      std::__cxx11::string::operator=((string *)in_RDI,"BX");
    }
  }
  return in_RDI;
}

Assistant:

static std::string getBoundType(const double lower, const double upper) {
  std::string type;
  if (highs_isInfinity(-lower)) {
    if (highs_isInfinity(upper)) {
      type = "FR";
    } else {
      type = "UB";
    }
  } else {
    if (highs_isInfinity(upper)) {
      type = "LB";
    } else {
      if (lower < upper) {
        type = "BX";
      } else {
        type = "FX";
      }
    }
  }
  return type;
}